

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void final_scene(int image_width,int samples_per_pixel,int max_depth)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  shared_ptr<lambertian> emat;
  shared_ptr<sphere> boundary;
  shared_ptr<lambertian> white;
  shared_ptr<noise_texture> pertext;
  shared_ptr<lambertian> sphere_material;
  shared_ptr<diffuse_light> light;
  shared_ptr<lambertian> ground;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  vec3 local_448;
  int local_430;
  int local_42c;
  hittable_list local_428;
  undefined1 local_3d8 [16];
  hittable_list local_3c8;
  shared_ptr<hittable> local_378;
  shared_ptr<hittable> local_368;
  double local_358;
  _func_int **local_350;
  pointer local_348;
  undefined1 local_340 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_318;
  vec3 local_310;
  vec3 local_2f8;
  __shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> local_2d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  __shared_ptr<material,(__gnu_cxx::_Lock_policy)2> local_2c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  vec3 local_2b8;
  shared_ptr<hittable> local_298;
  shared_ptr<hittable> local_288;
  shared_ptr<hittable> local_278;
  shared_ptr<hittable> local_268;
  shared_ptr<hittable> local_258;
  shared_ptr<hittable> local_248;
  shared_ptr<hittable> local_238;
  shared_ptr<hittable> local_228;
  shared_ptr<hittable> local_218;
  shared_ptr<hittable> local_208;
  hittable_list local_1f8;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  pointer local_198;
  pointer local_190;
  double dStack_188;
  double local_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  undefined1 local_108 [216];
  
  local_1f8.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001253d8;
  local_1f8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.bbox.x.min = INFINITY;
  local_1f8.bbox.x.max = -INFINITY;
  local_1f8.bbox.y.min = INFINITY;
  local_1f8.bbox.y.max = -INFINITY;
  local_1f8.bbox.z.min = INFINITY;
  local_1f8.bbox.z.max = -INFINITY;
  local_1a8 = (undefined1  [8])0x3fdeb851eb851eb8;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fea8f5c28f5c28f;
  local_198 = (pointer)0x3fe0f5c28f5c28f6;
  local_448.e[2]._0_4_ = image_width;
  local_448.e[2]._4_4_ = samples_per_pixel;
  local_430 = max_depth;
  std::make_shared<lambertian,vec3>(&local_310);
  iVar2 = 0;
  while (iVar2 != 0x14) {
    local_350 = (_func_int **)((double)iVar2 * 100.0 + -1000.0);
    local_358 = (double)local_350 + 100.0;
    local_42c = iVar2;
    for (iVar3 = 0; iVar3 != 0x14; iVar3 = iVar3 + 1) {
      local_348 = (pointer)((double)iVar3 * 100.0 + -1000.0);
      dVar1 = random_double();
      local_3c8.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(dVar1 * 100.0 + 1.0);
      local_1a8 = (undefined1  [8])local_350;
      _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_198 = local_348;
      local_3c8.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)((double)local_348 + 100.0);
      local_3c8.super_hittable._vptr_hittable = (_func_int **)local_358;
      std::__shared_ptr<material,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<lambertian,void>
                (local_2c8,(__shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2> *)&local_310);
      box((point3 *)&local_428,(point3 *)local_1a8,(shared_ptr<material> *)(local_3d8 + 0x10));
      local_368.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_428.super_hittable._vptr_hittable;
      local_368.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_428.objects.
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_428.super_hittable._vptr_hittable = (_func_int **)0x0;
      local_428.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      hittable_list::add(&local_1f8,&local_368);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_368.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.objects);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0);
    }
    iVar2 = local_42c + 1;
  }
  local_3c8.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001253d8;
  local_3c8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.bbox.x.min = INFINITY;
  local_3c8.bbox.x.max = -INFINITY;
  local_3c8.bbox.y.min = INFINITY;
  local_3c8.bbox.y.max = -INFINITY;
  local_3c8.bbox.z.min = INFINITY;
  local_3c8.bbox.z.max = -INFINITY;
  std::make_shared<bvh_node,hittable_list&>((hittable_list *)local_1a8);
  local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1a8;
  local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1a0._M_pi;
  local_1a8 = (undefined1  [8])0x0;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
  local_1a8 = (undefined1  [8])0x401c000000000000;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c000000000000;
  local_198 = (pointer)0x401c000000000000;
  std::make_shared<diffuse_light,vec3>((vec3 *)(local_340 + 0x20));
  local_1a8 = (undefined1  [8])0x405ec00000000000;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4081500000000000;
  local_198 = (pointer)0x4062600000000000;
  local_428.super_hittable._vptr_hittable = (_func_int **)0x4072c00000000000;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.e[0] = 0.0;
  local_2b8.e[1] = 0.0;
  local_2b8.e[2] = 265.0;
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<diffuse_light>&>
            (&local_2f8,(vec3 *)local_1a8,(vec3 *)&local_428,(shared_ptr<diffuse_light> *)&local_2b8
            );
  local_218.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2f8.e[0];
  local_218.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8.e[1];
  local_2f8.e[0] = 0.0;
  local_2f8.e[1] = 0.0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_218.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8.e + 1));
  local_2b8.e[0] = 400.0;
  local_2b8.e[1] = 400.0;
  local_2b8.e[2] = 200.0;
  local_2f8.e[0] = 430.0;
  local_2f8.e[1] = 400.0;
  local_2f8.e[2] = 200.0;
  local_1a8 = (undefined1  [8])0x3fe6666666666666;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fd3333333333333;
  local_198 = (pointer)0x3fb999999999999a;
  std::make_shared<lambertian,vec3>((vec3 *)(local_340 + 0x10));
  local_428.super_hittable._vptr_hittable._0_4_ = 0x32;
  std::make_shared<sphere,vec3&,vec3&,int,std::shared_ptr<lambertian>&>
            ((vec3 *)local_1a8,&local_2b8,(int *)&local_2f8,(shared_ptr<lambertian> *)&local_428);
  local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1a8;
  local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1a0._M_pi;
  local_1a8 = (undefined1  [8])0x0;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
  local_1a8 = (undefined1  [8])0x4070400000000000;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4062c00000000000;
  local_198 = (pointer)0x4046800000000000;
  local_468._16_4_ = 0x32;
  local_488._0_8_ = (element_type *)0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)local_478);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)&local_428,(int *)local_1a8,(shared_ptr<dielectric> *)(local_468 + 0x10));
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_428.super_hittable._vptr_hittable;
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_428.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_428.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.objects);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_478 + 8));
  local_1a8 = (undefined1  [8])0x0;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4062c00000000000;
  local_198 = (pointer)0x4062200000000000;
  local_468._0_4_ = 0x32;
  local_428.super_hittable._vptr_hittable = (_func_int **)0x3fe999999999999a;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x3fe999999999999a;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x3feccccccccccccd;
  local_468._16_8_ = 1.0;
  std::make_shared<metal,vec3,double>((vec3 *)local_488,(double *)&local_428);
  std::make_shared<sphere,vec3,int,std::shared_ptr<metal>>
            ((vec3 *)local_478,(int *)local_1a8,(shared_ptr<metal> *)local_468);
  local_248.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_478._0_8_;
  local_248.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_478._8_8_;
  local_478._0_8_ = (element_type *)0x0;
  local_478._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_478 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_488 + 8));
  local_1a8 = (undefined1  [8])0x4076800000000000;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4062c00000000000;
  local_198 = (pointer)0x4062200000000000;
  local_468._16_4_ = 0x46;
  local_488._0_8_ = (element_type *)0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)&local_428);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)local_478,(int *)local_1a8,(shared_ptr<dielectric> *)(local_468 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.objects);
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<sphere,void>
            (local_2d8,(__shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2> *)local_478);
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),(shared_ptr<hittable> *)local_2d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0);
  local_488._0_8_ = (element_type *)0x3fc999999999999a;
  local_1a8 = (undefined1  [8])0x3fc999999999999a;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fd999999999999a;
  local_198 = (pointer)0x3feccccccccccccd;
  std::make_shared<constant_medium,std::shared_ptr<sphere>&,double,vec3>
            ((shared_ptr<sphere> *)&local_428,(double *)local_478,(vec3 *)local_488);
  local_258.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_428.super_hittable._vptr_hittable;
  local_258.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_428.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_428.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_258.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.objects);
  local_198 = (pointer)0x0;
  local_1a8 = (undefined1  [8])0x0;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_468._0_4_ = 5000;
  local_468._16_8_ = 1.5;
  std::make_shared<dielectric,double>((double *)local_488);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)&local_428,(int *)local_1a8,(shared_ptr<dielectric> *)local_468);
  std::__shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2> *)local_478,
             (__shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2> *)&local_428);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.objects);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_488 + 8));
  local_488._0_8_ = (element_type *)0x3f1a36e2eb1c432d;
  local_1a8 = (undefined1  [8])0x3ff0000000000000;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  local_198 = (pointer)0x3ff0000000000000;
  std::make_shared<constant_medium,std::shared_ptr<sphere>&,double,vec3>
            ((shared_ptr<sphere> *)&local_428,(double *)local_478,(vec3 *)local_488);
  local_268.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_428.super_hittable._vptr_hittable;
  local_268.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_428.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_428.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_268.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.objects);
  std::make_shared<image_texture,char_const(&)[13]>((char (*) [13])local_1a8);
  std::make_shared<lambertian,std::shared_ptr<image_texture>>
            ((shared_ptr<image_texture> *)local_488);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
  local_1a8 = (undefined1  [8])0x4079000000000000;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4069000000000000;
  local_198 = (pointer)0x4079000000000000;
  local_468._16_4_ = 100;
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>&>
            ((vec3 *)&local_428,(int *)local_1a8,(shared_ptr<lambertian> *)(local_468 + 0x10));
  local_278.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_428.super_hittable._vptr_hittable;
  local_278.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_428.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_428.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.objects);
  local_1a8 = (undefined1  [8])0x3fc999999999999a;
  std::make_shared<noise_texture,double>((double *)(local_468 + 0x10));
  local_1a8 = (undefined1  [8])0x406b800000000000;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4071800000000000;
  local_198 = (pointer)0x4072c00000000000;
  local_448.e[0] = (double)CONCAT44(local_448.e[0]._4_4_,0x50);
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)local_468);
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)&local_428,(int *)local_1a8,(shared_ptr<lambertian> *)&local_448);
  local_288.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_428.super_hittable._vptr_hittable;
  local_288.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_428.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_428.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_288.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.objects);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_468 + 8));
  local_428.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001253d8;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428.bbox.x.min = INFINITY;
  local_428.bbox.x.max = -INFINITY;
  local_428.bbox.y.min = INFINITY;
  local_428.bbox.y.max = -INFINITY;
  local_428.bbox.z.min = INFINITY;
  local_428.bbox.z.max = -INFINITY;
  local_1a8 = (undefined1  [8])0x3fe75c28f5c28f5c;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe75c28f5c28f5c;
  local_198 = (pointer)0x3fe75c28f5c28f5c;
  std::make_shared<lambertian,vec3>((vec3 *)local_468);
  iVar2 = 1000;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    vec3::random();
    local_3d8._0_4_ = 10;
    std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>&>
              (&local_448,(int *)local_1a8,(shared_ptr<lambertian> *)local_3d8);
    local_378.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_448.e[0];
    local_378.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448.e[1];
    local_448.e[0] = 0.0;
    local_448.e[1] = 0.0;
    hittable_list::add(&local_428,&local_378);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_378.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_448.e + 1));
  }
  std::make_shared<bvh_node,hittable_list&>((hittable_list *)local_340);
  local_310.e[2]._4_4_ = 0xf;
  std::make_shared<rotate_y,std::shared_ptr<bvh_node>,int>
            ((shared_ptr<bvh_node> *)local_3d8,(int *)local_340);
  local_1a8 = (undefined1  [8])0xc059000000000000;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4070e00000000000;
  local_198 = (pointer)0x4078b00000000000;
  std::make_shared<translate,std::shared_ptr<rotate_y>,vec3>
            ((shared_ptr<rotate_y> *)&local_448,(vec3 *)local_3d8);
  local_298.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_448.e[0];
  local_298.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448.e[1];
  local_448.e[0] = 0.0;
  local_448.e[1] = 0.0;
  hittable_list::add((hittable_list *)(local_3d8 + 0x10),&local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_298.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_448.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_340 + 8));
  local_120 = 10.0;
  memset(local_108,0,0xd8);
  local_1a8 = (undefined1  [8])0x3ff0000000000000;
  _Stack_1a0._M_pi._4_4_ = local_448.e[2]._4_4_;
  _Stack_1a0._M_pi._0_4_ = local_448.e[2]._0_4_;
  local_198 = (pointer)CONCAT44(local_198._4_4_,local_430);
  local_190 = (pointer)0x0;
  dStack_188 = 0.0;
  local_180 = 0.0;
  local_178 = 40.0;
  dStack_170 = 478.0;
  local_168 = 278.0;
  dStack_160 = -600.0;
  local_158 = 278.0;
  dStack_150 = 278.0;
  local_148 = 0.0;
  dStack_140 = 0.0;
  local_138 = 1.0;
  local_130 = 0.0;
  dStack_128 = 0.0;
  camera::render((camera *)local_1a8,(hittable *)(local_3d8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_468 + 8));
  hittable_list::~hittable_list(&local_428);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_450);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_488 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_478 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_340 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318);
  hittable_list::~hittable_list((hittable_list *)(local_3d8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_310.e + 1));
  hittable_list::~hittable_list(&local_1f8);
  return;
}

Assistant:

void final_scene(int image_width, int samples_per_pixel, int max_depth) {
    hittable_list boxes1;
    auto ground = make_shared<lambertian>(color(0.48, 0.83, 0.53));

    int boxes_per_side = 20;
    for (int i = 0; i < boxes_per_side; i++) {
        for (int j = 0; j < boxes_per_side; j++) {
            auto w = 100.0;
            auto x0 = -1000.0 + i*w;
            auto z0 = -1000.0 + j*w;
            auto y0 = 0.0;
            auto x1 = x0 + w;
            auto y1 = random_double(1,101);
            auto z1 = z0 + w;

            boxes1.add(box(point3(x0,y0,z0), point3(x1,y1,z1), ground));
        }
    }

    hittable_list world;

    world.add(make_shared<bvh_node>(boxes1));

    auto light = make_shared<diffuse_light>(color(7, 7, 7));
    world.add(make_shared<quad>(point3(123,554,147), vec3(300,0,0), vec3(0,0,265), light));

    auto center1 = point3(400, 400, 200);
    auto center2 = center1 + vec3(30,0,0);
    auto sphere_material = make_shared<lambertian>(color(0.7, 0.3, 0.1));
    world.add(make_shared<sphere>(center1, center2, 50, sphere_material));

    world.add(make_shared<sphere>(point3(260, 150, 45), 50, make_shared<dielectric>(1.5)));
    world.add(make_shared<sphere>(
        point3(0, 150, 145), 50, make_shared<metal>(color(0.8, 0.8, 0.9), 1.0)
    ));

    auto boundary = make_shared<sphere>(point3(360,150,145), 70, make_shared<dielectric>(1.5));
    world.add(boundary);
    world.add(make_shared<constant_medium>(boundary, 0.2, color(0.2, 0.4, 0.9)));
    boundary = make_shared<sphere>(point3(0,0,0), 5000, make_shared<dielectric>(1.5));
    world.add(make_shared<constant_medium>(boundary, .0001, color(1,1,1)));

    auto emat = make_shared<lambertian>(make_shared<image_texture>("earthmap.jpg"));
    world.add(make_shared<sphere>(point3(400,200,400), 100, emat));
    auto pertext = make_shared<noise_texture>(0.2);
    world.add(make_shared<sphere>(point3(220,280,300), 80, make_shared<lambertian>(pertext)));

    hittable_list boxes2;
    auto white = make_shared<lambertian>(color(.73, .73, .73));
    int ns = 1000;
    for (int j = 0; j < ns; j++) {
        boxes2.add(make_shared<sphere>(point3::random(0,165), 10, white));
    }

    world.add(make_shared<translate>(
        make_shared<rotate_y>(
            make_shared<bvh_node>(boxes2), 15),
            vec3(-100,270,395)
        )
    );

    camera cam;

    cam.aspect_ratio      = 1.0;
    cam.image_width       = image_width;
    cam.samples_per_pixel = samples_per_pixel;
    cam.max_depth         = max_depth;
    cam.background        = color(0,0,0);

    cam.vfov     = 40;
    cam.lookfrom = point3(478, 278, -600);
    cam.lookat   = point3(278, 278, 0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0;

    cam.render(world);
}